

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_USADA8(DisasContext_conflict1 *s,arg_USADA8 *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 retval;
  TCGv_i32 pTVar2;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  arg_USADA8 *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,3);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    retval = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    gen_helper_usad8(tcg_ctx_00,retval,retval,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    if (a->ra != 0xf) {
      pTVar2 = load_reg(s,a->ra);
      tcg_gen_add_i32(tcg_ctx_00,retval,retval,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
    }
    store_reg(s,a->rd,retval);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_USADA8(DisasContext *s, arg_USADA8 *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    gen_helper_usad8(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    if (a->ra != 15) {
        t2 = load_reg(s, a->ra);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    store_reg(s, a->rd, t1);
    return true;
}